

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O2

void jpc_irct(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  int iVar1;
  ulong uVar2;
  jas_seqent_t *pjVar3;
  jas_seqent_t *pjVar4;
  jas_seqent_t *pjVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  iVar6 = (int)c0->numrows_;
  if (c1->numrows_ == (long)iVar6) {
    uVar2 = c0->numcols_;
    if (((c1->numcols_ == (long)(int)uVar2) && (c2->numrows_ == c1->numrows_)) &&
       (c2->numcols_ == c1->numcols_)) {
      uVar10 = 0;
      uVar7 = c0->numrows_ & 0xffffffff;
      if (iVar6 < 1) {
        uVar7 = uVar10;
      }
      for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        pjVar3 = c0->rows_[uVar10];
        pjVar4 = c1->rows_[uVar10];
        pjVar5 = c2->rows_[uVar10];
        lVar8 = 0;
        for (uVar9 = uVar2 & 0xffffffff; 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
          iVar6 = *(int *)((long)pjVar4 + lVar8);
          iVar1 = *(int *)((long)pjVar5 + lVar8);
          iVar11 = *(int *)((long)pjVar3 + lVar8) - (int)((ulong)(long)(iVar1 + iVar6) >> 2);
          *(long *)((long)pjVar3 + lVar8) = (long)(iVar1 + iVar11);
          *(long *)((long)pjVar4 + lVar8) = (long)iVar11;
          *(long *)((long)pjVar5 + lVar8) = (long)(iVar6 + iVar11);
          lVar8 = lVar8 + 8;
        }
      }
      return;
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0x93,"void jpc_irct(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_irct(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	numcols = jas_matrix_numcols(c0);

	/* All three matrices must have the same dimensions. */
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols
	  && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols);

	for (i = 0; i < numrows; i++) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			int r;
			int g;
			int b;
			int y;
			int u;
			int v;
			y = *c0p;
			u = *c1p;
			v = *c2p;
			//g = y - ((u + v) >> 2);
			g = y - jpc_fix_asr(u + v, 2);
			r = v + g;
			b = u + g;
			*c0p++ = r;
			*c1p++ = g;
			*c2p++ = b;
		}
	}
}